

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_525a::ktxStreamTest_CanWriteKtx2ToCppStream_Test::
~ktxStreamTest_CanWriteKtx2ToCppStream_Test(ktxStreamTest_CanWriteKtx2ToCppStream_Test *this)

{
  basic_streambuf<char,_std::char_traits<char>_> *pbVar1;
  
  (this->super_ktxStreamTest).super_Test._vptr_Test = (_func_int **)&PTR__ktxStreamTest_00152ab0;
  pbVar1 = (this->super_ktxStreamTest)._ktx2Streambuf._M_t.
           super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  if (pbVar1 != (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar1 + 8))();
  }
  (this->super_ktxStreamTest)._ktx2Streambuf._M_t.
  super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>._M_head_impl
       = (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
  pbVar1 = (this->super_ktxStreamTest)._ktx1Streambuf._M_t.
           super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  if (pbVar1 != (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar1 + 8))();
  }
  (this->super_ktxStreamTest)._ktx1Streambuf._M_t.
  super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>._M_head_impl
       = (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanWriteKtx2ToCppStream)
{
    KTX_error_code err{KTX_INVALID_VALUE};
    auto dstStreambuf = std::make_unique<std::stringbuf>();
    StreambufStream dstStream{std::move(dstStreambuf)};

    KtxTexture<ktxTexture2> srcTexture2;
    KtxTexture<ktxTexture2> dstTexture2;

    {
        std::cerr << "Loading KTX2 from file" << std::endl;

        StreambufStream srcStream{std::move(_ktx2Streambuf), std::ios::in};
        err = ktxTexture2_CreateFromStream(srcStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, srcTexture2.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load source KTX2 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(srcTexture2, nullptr) << "Source KTX2 is null";
        EXPECT_TRUE(srcStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
    }
    {
        std::cerr << "Writing KTX2 -> copied KTX2" << std::endl;

        // We're about to write to `dstStream`
        dstStream.seek_mode(std::ios::out);

        err = ktxTexture_WriteToStream(srcTexture2.handle<ktxTexture>(), dstStream.stream());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to convert KTX1 -> KTX2 to C++ stream: " << ktxErrorString(err);
    }
    {
        std::cerr << "Loading the converted KTX2" << std::endl;

        // Rewind dstStream and set it up for reading
        dstStream.streambuf()->pubseekpos(0, std::ios::in);
        dstStream.seek_mode(std::ios::in);

        err = ktxTexture2_CreateFromStream(dstStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, dstTexture2.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load converted KTX2 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(dstTexture2, nullptr) << "Destination KTX2 is null";
    }

    // Should be a clone of the same texture
    expectSameTextureContent(srcTexture2.handle<ktxTexture>(), dstTexture2.handle<ktxTexture>());
}